

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O2

void __thiscall CSHA512::Finalize(CSHA512 *this,uchar *hash)

{
  long lVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  uchar sizedesc [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sizedesc[0] = '\0';
  sizedesc[1] = '\0';
  sizedesc[2] = '\0';
  sizedesc[3] = '\0';
  sizedesc[4] = '\0';
  sizedesc[5] = '\0';
  sizedesc[6] = '\0';
  sizedesc[7] = '\0';
  sizedesc[8] = '\0';
  sizedesc[9] = '\0';
  sizedesc[10] = '\0';
  sizedesc[0xb] = '\0';
  sizedesc[0xc] = '\0';
  sizedesc[0xd] = '\0';
  sizedesc[0xe] = '\0';
  sizedesc[0xf] = '\0';
  uVar2 = this->bytes;
  WriteBE64(sizedesc + 8,uVar2 * 8);
  Write(this,Finalize::pad,(ulong)(0x6fU - (int)uVar2 & 0x7f) + 1);
  Write(this,sizedesc,0x10);
  WriteBE64(hash,this->s[0]);
  WriteBE64(hash + 8,this->s[1]);
  WriteBE64(hash + 0x10,this->s[2]);
  WriteBE64(hash + 0x18,this->s[3]);
  WriteBE64(hash + 0x20,this->s[4]);
  WriteBE64(hash + 0x28,this->s[5]);
  WriteBE64(hash + 0x30,this->s[6]);
  WriteBE64(hash + 0x38,this->s[7]);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CSHA512::Finalize(unsigned char hash[OUTPUT_SIZE])
{
    static const unsigned char pad[128] = {0x80};
    unsigned char sizedesc[16] = {0x00};
    WriteBE64(sizedesc + 8, bytes << 3);
    Write(pad, 1 + ((239 - (bytes % 128)) % 128));
    Write(sizedesc, 16);
    WriteBE64(hash, s[0]);
    WriteBE64(hash + 8, s[1]);
    WriteBE64(hash + 16, s[2]);
    WriteBE64(hash + 24, s[3]);
    WriteBE64(hash + 32, s[4]);
    WriteBE64(hash + 40, s[5]);
    WriteBE64(hash + 48, s[6]);
    WriteBE64(hash + 56, s[7]);
}